

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O2

RC __thiscall
RM_FileHandle::GetFirstZeroBit(RM_FileHandle *this,char *bitmap,int size,int *location)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  if (size < 1) {
    size = 0;
  }
  while( true ) {
    uVar1 = (uint)uVar2;
    if (size == uVar1) {
      return 0x69;
    }
    if (((byte)bitmap[uVar2 >> 3] >> (uVar1 & 7) & 1) == 0) break;
    uVar2 = (ulong)(uVar1 + 1);
  }
  *location = uVar1;
  return 0;
}

Assistant:

RC RM_FileHandle::GetFirstZeroBit(char *bitmap, int size, int &location){
  for(int i = 0; i < size; i++){
    int chunk = i /8;
    int offset = i - chunk*8;
    if ((bitmap[chunk] & (1 << offset)) == 0){
      location = i;
      return (0);
    }
  }
  return RM_PAGEFULL;
}